

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool gen_load(DisasContext_conflict12 *ctx,arg_lb *a,MemOp memop)

{
  TCGContext_conflict11 *s;
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *a2;
  uintptr_t o;
  TCGv_i64 a2_00;
  TCGOpcode opc;
  uintptr_t o_2;
  TCGv_i64 ret;
  uintptr_t o_3;
  TCGv_i64 val;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  a2 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  val = (TCGv_i64)((long)a2 - (long)s);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    a2_00 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs1] == ret) goto LAB_00c7a4fd;
    a2_00 = s->cpu_gpr[a->rs1] + (long)s;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,opc,(TCGArg)a1,(TCGArg)a2_00);
LAB_00c7a4fd:
  tcg_gen_addi_i64_riscv64(s,ret,ret,(long)a->imm);
  tcg_gen_qemu_ld_i64_riscv64(s,val,ret,(ulong)ctx->mem_idx,memop);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != val)) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a2);
  }
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(val + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static inline TCGv gen_load(DisasContext *s, int opsize, TCGv addr,
                            int sign, int index)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;
    tmp = tcg_temp_new_i32(tcg_ctx);
    switch(opsize) {
    case OS_BYTE:
        if (sign)
            tcg_gen_qemu_ld8s(tcg_ctx, tmp, addr, index);
        else
            tcg_gen_qemu_ld8u(tcg_ctx, tmp, addr, index);
        break;
    case OS_WORD:
        if (sign)
            tcg_gen_qemu_ld16s(tcg_ctx, tmp, addr, index);
        else
            tcg_gen_qemu_ld16u(tcg_ctx, tmp, addr, index);
        break;
    case OS_LONG:
        tcg_gen_qemu_ld32u(tcg_ctx, tmp, addr, index);
        break;
    default:
        g_assert_not_reached();
    }
    return tmp;
}